

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c++
# Opt level: O0

Maybe<kj::Own<kj::_::Event>_> __thiscall kj::TaskSet::Task::fire(Task *this)

{
  bool bVar1;
  PromiseNode *pPVar2;
  NullableValue<kj::Exception> *other;
  Exception *pEVar3;
  Task *pTVar4;
  Own<kj::TaskSet::Task> **ppOVar5;
  Own<kj::TaskSet::Task> *other_00;
  Event *pEVar6;
  Maybe<kj::Own<kj::TaskSet::Task>_> *other_01;
  PromiseFulfiller<void> *pPVar7;
  Own<kj::_::Event> *t;
  Type *func;
  Event *extraout_RDX;
  Event *in_RSI;
  Maybe<kj::Own<kj::_::Event>_> MVar8;
  Maybe<kj::Own<kj::PromiseFulfiller<void>_>_> local_4c8;
  undefined1 local_4b1;
  Own<kj::PromiseFulfiller<void>_> *local_4b0;
  Own<kj::PromiseFulfiller<void>_> *f_1;
  Fault local_498;
  Fault f;
  Fault local_488;
  Own<kj::TaskSet::Task> *local_480;
  Own<kj::TaskSet::Task> *_kj_result;
  Own<kj::_::Event> self;
  Own<kj::TaskSet::Task> *n;
  Exception *e;
  Maybe<kj::Exception> local_450;
  undefined1 local_2f0 [8];
  NullableValue<kj::Exception> exception;
  undefined1 local_180 [8];
  ExceptionOr<kj::_::Void> result;
  Task *this_local;
  
  _::ExceptionOr<kj::_::Void>::ExceptionOr((ExceptionOr<kj::_::Void> *)local_180);
  pPVar2 = Own<kj::_::PromiseNode>::operator->((Own<kj::_::PromiseNode> *)&in_RSI[1].firing);
  (*pPVar2->_vptr_PromiseNode[2])(pPVar2,local_180);
  runCatchingExceptions<kj::TaskSet::Task::fire()::_lambda()_1_>(&local_450,(kj *)&e,func);
  other = _::readMaybe<kj::Exception>(&local_450);
  _::NullableValue<kj::Exception>::NullableValue((NullableValue<kj::Exception> *)local_2f0,other);
  Maybe<kj::Exception>::~Maybe(&local_450);
  pEVar3 = _::NullableValue::operator_cast_to_Exception_((NullableValue *)local_2f0);
  if (pEVar3 != (Exception *)0x0) {
    pEVar3 = _::NullableValue<kj::Exception>::operator*((NullableValue<kj::Exception> *)local_2f0);
    pEVar3 = mv<kj::Exception>(pEVar3);
    _::ExceptionOrValue::addException((ExceptionOrValue *)local_180,pEVar3);
  }
  _::NullableValue<kj::Exception>::~NullableValue((NullableValue<kj::Exception> *)local_2f0);
  pEVar3 = _::readMaybe<kj::Exception>((Maybe<kj::Exception> *)local_180);
  if (pEVar3 != (Exception *)0x0) {
    pEVar6 = *in_RSI[1].prev;
    pEVar3 = mv<kj::Exception>(pEVar3);
    (**pEVar6->_vptr_Event)(pEVar6,pEVar3);
  }
  self.ptr = (Event *)_::readMaybe<kj::TaskSet::Task>
                                ((Maybe<kj::Own<kj::TaskSet::Task>_> *)(in_RSI + 1));
  if (self.ptr != (Event *)0x0) {
    pEVar6 = in_RSI[1].next;
    pTVar4 = Own<kj::TaskSet::Task>::get((Own<kj::TaskSet::Task> *)self.ptr);
    pTVar4->prev = (Maybe<kj::Own<kj::TaskSet::Task>_> *)pEVar6;
  }
  local_480 = _::readMaybe<kj::TaskSet::Task>((Maybe<kj::Own<kj::TaskSet::Task>_> *)in_RSI[1].next);
  if (local_480 == (Own<kj::TaskSet::Task> *)0x0) {
    _::Debug::Fault::Fault
              (&local_488,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async.c++"
               ,0xc3,FAILED,"*prev != nullptr","");
    _::Debug::Fault::fatal(&local_488);
  }
  ppOVar5 = mv<kj::Own<kj::TaskSet::Task>*>(&local_480);
  f.exception = (Exception *)*ppOVar5;
  other_00 = mv<kj::Own<kj::TaskSet::Task>>((Own<kj::TaskSet::Task> *)f.exception);
  Own<kj::_::Event>::Own<kj::TaskSet::Task,void>((Own<kj::_::Event> *)&_kj_result,other_00);
  pEVar6 = Own<kj::_::Event>::get((Own<kj::_::Event> *)&_kj_result);
  if (pEVar6 != in_RSI) {
    _::Debug::Fault::Fault
              (&local_498,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async.c++"
               ,0xc4,FAILED,"self.get() == this","");
    _::Debug::Fault::fatal(&local_498);
  }
  other_01 = mv<kj::Maybe<kj::Own<kj::TaskSet::Task>>>
                       ((Maybe<kj::Own<kj::TaskSet::Task>_> *)(in_RSI + 1));
  Maybe<kj::Own<kj::TaskSet::Task>_>::operator=
            ((Maybe<kj::Own<kj::TaskSet::Task>_> *)in_RSI[1].next,other_01);
  Maybe<kj::Own<kj::TaskSet::Task>_>::Maybe((Maybe<kj::Own<kj::TaskSet::Task>_> *)&f_1,(void *)0x0);
  Maybe<kj::Own<kj::TaskSet::Task>_>::operator=
            ((Maybe<kj::Own<kj::TaskSet::Task>_> *)(in_RSI + 1),
             (Maybe<kj::Own<kj::TaskSet::Task>_> *)&f_1);
  Maybe<kj::Own<kj::TaskSet::Task>_>::~Maybe((Maybe<kj::Own<kj::TaskSet::Task>_> *)&f_1);
  in_RSI[1].next = (Event *)0x0;
  local_4b0 = _::readMaybe<kj::PromiseFulfiller<void>>
                        ((Maybe<kj::Own<kj::PromiseFulfiller<void>_>_> *)(in_RSI[1].prev + 3));
  if ((local_4b0 != (Own<kj::PromiseFulfiller<void>_> *)0x0) &&
     (bVar1 = Maybe<kj::Own<kj::TaskSet::Task>_>::operator==
                        ((Maybe<kj::Own<kj::TaskSet::Task>_> *)(in_RSI[1].prev + 1),(void *)0x0),
     bVar1)) {
    pPVar7 = Own<kj::PromiseFulfiller<void>_>::get(local_4b0);
    (**pPVar7->_vptr_PromiseFulfiller)(pPVar7,&local_4b1);
    Maybe<kj::Own<kj::PromiseFulfiller<void>_>_>::Maybe(&local_4c8,(void *)0x0);
    Maybe<kj::Own<kj::PromiseFulfiller<void>_>_>::operator=
              ((Maybe<kj::Own<kj::PromiseFulfiller<void>_>_> *)(in_RSI[1].prev + 3),&local_4c8);
    Maybe<kj::Own<kj::PromiseFulfiller<void>_>_>::~Maybe(&local_4c8);
  }
  t = mv<kj::Own<kj::_::Event>>((Own<kj::_::Event> *)&_kj_result);
  Maybe<kj::Own<kj::_::Event>_>::Maybe((Maybe<kj::Own<kj::_::Event>_> *)this,t);
  Own<kj::_::Event>::~Own((Own<kj::_::Event> *)&_kj_result);
  _::ExceptionOr<kj::_::Void>::~ExceptionOr((ExceptionOr<kj::_::Void> *)local_180);
  MVar8.ptr.ptr = extraout_RDX;
  MVar8.ptr.disposer = (Disposer *)this;
  return (Maybe<kj::Own<kj::_::Event>_>)MVar8.ptr;
}

Assistant:

Maybe<Own<Event>> fire() override {
    // Get the result.
    _::ExceptionOr<_::Void> result;
    node->get(result);

    // Delete the node, catching any exceptions.
    KJ_IF_MAYBE(exception, kj::runCatchingExceptions([this]() {
      node = nullptr;
    })) {
      result.addException(kj::mv(*exception));
    }

    // Call the error handler if there was an exception.
    KJ_IF_MAYBE(e, result.exception) {
      taskSet.errorHandler.taskFailed(kj::mv(*e));
    }

    // Remove from the task list.
    KJ_IF_MAYBE(n, next) {
      n->get()->prev = prev;
    }
    Own<Event> self = kj::mv(KJ_ASSERT_NONNULL(*prev));
    KJ_ASSERT(self.get() == this);
    *prev = kj::mv(next);
    next = nullptr;
    prev = nullptr;

    KJ_IF_MAYBE(f, taskSet.emptyFulfiller) {
      if (taskSet.tasks == nullptr) {
        f->get()->fulfill();
        taskSet.emptyFulfiller = nullptr;
      }
    }

    return mv(self);
  }